

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::QHttpThreadDelegate(QHttpThreadDelegate *this,QObject *parent)

{
  long lVar1;
  QObject *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<char> *this_00;
  QObject *url;
  totally_ordered_wrapper<char_*> in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  url = in_RDI;
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_0049e628;
  in_RDI[0x10] = (QObject)0x0;
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
             (in_RDI + 0x18),(QSslConfiguration *)0x0);
  this_00 = (QSharedPointer<char> *)&stack0xfffffffffffffff0;
  QUrl::QUrl((QUrl *)this_00);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)in_stack_fffffffffffffff0.ptr,(QUrl *)url,
             (Operation)((ulong)in_RSI >> 0x20),(Priority)in_RSI);
  QUrl::~QUrl((QUrl *)this_00);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  std::shared_ptr<QAtomicInt>::shared_ptr((shared_ptr<QAtomicInt> *)0x30d2d5);
  std::shared_ptr<QAtomicInt>::shared_ptr((shared_ptr<QAtomicInt> *)0x30d2e3);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x30d2f1);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x30d2ff);
  std::shared_ptr<QNetworkAccessAuthenticationManager>::shared_ptr
            ((shared_ptr<QNetworkAccessAuthenticationManager> *)0x30d30d);
  in_RDI[0x88] = (QObject)0x0;
  *(undefined8 *)(in_RDI + 0x90) = 0xffffffffffffffff;
  QByteArray::QByteArray((QByteArray *)0x30d330);
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)0x30d341);
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  QString::QString((QString *)0x30d35c);
  in_RDI[0xd8] = (QObject)0x0;
  in_RDI[0xd9] = (QObject)0x0;
  in_RDI[0xda] = (QObject)0x0;
  *(undefined8 *)(in_RDI + 0xe0) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0xe8) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0xf0) = 0;
  QString::QString((QString *)0x30d3a2);
  QHttp1Configuration::QHttp1Configuration((QHttp1Configuration *)in_RSI);
  QHttp2Configuration::QHttp2Configuration((QHttp2Configuration *)this_00);
  QSharedPointer<char>::QSharedPointer(this_00);
  *(undefined8 *)(in_RDI + 0x130) = 0;
  QByteArray::QByteArray((QByteArray *)0x30d3f1);
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpThreadDelegate::QHttpThreadDelegate(QObject *parent) :
    QObject(parent)
    , ssl(false)
    , downloadBufferMaximumSize(0)
    , readBufferMaxSize(0)
    , bytesEmitted(0)
    , pendingDownloadData()
    , pendingDownloadProgress()
    , synchronous(false)
    , connectionCacheExpiryTimeoutSeconds(-1)
    , incomingStatusCode(0)
    , isPipeliningUsed(false)
    , isHttp2Used(false)
    , incomingContentLength(-1)
    , removedContentLength(-1)
    , incomingErrorCode(QNetworkReply::NoError)
    , downloadBuffer()
    , httpConnection(nullptr)
    , httpReply(nullptr)
    , synchronousRequestLoop(nullptr)
{
}